

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundedQueue.h
# Opt level: O0

void __thiscall
Glucose::bqueue<unsigned_int>::copyTo(bqueue<unsigned_int> *this,bqueue<unsigned_int> *dest)

{
  long in_RSI;
  vec<unsigned_int> *in_RDI;
  vec<unsigned_int> *unaff_retaddr;
  
  *(undefined4 *)(in_RSI + 0x14) = *(undefined4 *)((long)&in_RDI[1].data + 4);
  *(undefined8 *)(in_RSI + 0x18) = *(undefined8 *)&in_RDI[1].sz;
  *(undefined4 *)(in_RSI + 0x20) = *(undefined4 *)&in_RDI[2].data;
  *(undefined4 *)(in_RSI + 0x24) = *(undefined4 *)((long)&in_RDI[2].data + 4);
  *(byte *)(in_RSI + 0x28) = (byte)in_RDI[2].sz & 1;
  *(uint **)(in_RSI + 0x30) = in_RDI[3].data;
  *(undefined8 *)(in_RSI + 0x38) = *(undefined8 *)&in_RDI[3].sz;
  *(undefined4 *)(in_RSI + 0x10) = *(undefined4 *)&in_RDI[1].data;
  vec<unsigned_int>::copyTo(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void copyTo(bqueue &dest) const {
        dest.last = last;
        dest.sumofqueue = sumofqueue;
        dest.maxsize = maxsize;
        dest.queuesize = queuesize;
        dest.expComputed = expComputed;
        dest.exp = exp;
        dest.value = value;
        dest.first = first;        
        elems.copyTo(dest.elems);
    }